

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.cpp
# Opt level: O1

bool __thiscall BigInt::operator<(BigInt *this,BigInt *b)

{
  int iVar1;
  bool bVar2;
  string local_58;
  string local_38;
  
  to_string_abi_cxx11_(&local_58,this);
  to_string_abi_cxx11_(&local_38,b);
  if (local_58._M_string_length == local_38._M_string_length) {
    if (local_58._M_string_length == 0) {
      bVar2 = true;
    }
    else {
      iVar1 = bcmp(local_58._M_dataplus._M_p,local_38._M_dataplus._M_p,local_58._M_string_length);
      bVar2 = iVar1 == 0;
    }
  }
  else {
    bVar2 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  if (bVar2) {
    bVar2 = false;
  }
  else {
    bVar2 = greater(this,b);
    bVar2 = !bVar2;
  }
  return bVar2;
}

Assistant:

bool BigInt::operator<(BigInt&& b) {
    if (this->to_string() == b.to_string()) {
        return false;
    }
    return !this->greater(b);
}